

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrinkles.cpp
# Opt level: O3

void __thiscall Wrinkles::apply(Wrinkles *this,Vector *p,SurfaceData *t)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector local_68;
  undefined1 local_48 [16];
  double local_38;
  
  dVar8 = 0.0;
  if ((this->amount == 0.0) && (!NAN(this->amount))) {
    return;
  }
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar5 = 1.0;
  iVar1 = 10;
  do {
    local_68.z = p->z * dVar5;
    local_68.x = p->x * dVar5;
    local_68.y = p->y * dVar5;
    noise_3d((Vector *)local_48,&local_68);
    auVar3._8_8_ = dVar5;
    auVar3._0_8_ = dVar5;
    auVar3 = divpd(local_48,auVar3);
    dVar6 = dVar6 + ABS(auVar3._0_8_);
    dVar7 = dVar7 + ABS(auVar3._8_8_);
    dVar8 = dVar8 + ABS(local_38 / dVar5);
    dVar5 = dVar5 + dVar5;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  dVar5 = this->amount;
  dVar8 = dVar8 * dVar5 + (t->n).z;
  auVar2._0_8_ = (t->n).x + dVar6 * dVar5;
  auVar2._8_8_ = (t->n).y + dVar7 * dVar5;
  auVar4._0_8_ = SQRT(dVar8 * dVar8 + auVar2._0_8_ * auVar2._0_8_ + auVar2._8_8_ * auVar2._8_8_);
  auVar4._8_8_ = auVar4._0_8_;
  auVar3 = divpd(auVar2,auVar4);
  (t->n).x = (double)auVar3._0_8_;
  (t->n).y = (double)auVar3._8_8_;
  (t->n).z = dVar8 / auVar4._0_8_;
  return;
}

Assistant:

void Wrinkles::apply( Vector& p, Grayzer::SurfaceData& t )
{
   Vector result (0.0);
   Vector value;
   double scale = 1.0;
   int   i;

   if(   amount == 0.0 )   return;

   for( i = 0; i <   10;   scale *= 2.0, i++ )
   {
      value =  noise_3d( p * scale  );
      result.x += fabs(value.x / scale);
      result.y += fabs(value.y / scale);
      result.z += fabs(value.z / scale);
   }
   t.n   += result * amount;
   t.n   = normalize( t.n );
}